

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::IGrouping<bool,_int_&>::IGrouping
          (IGrouping<bool,_int_&> *this,bool key,shared_ptr<linq::IState<int_&>_> *state)

{
  __shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&state->super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>)
  ;
  IEnumerable<int_&>::IEnumerable
            (&this->super_IEnumerable<int_&>,(shared_ptr<linq::IState<int_&>_> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  (this->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_0013e648;
  this->Key = key;
  return;
}

Assistant:

IGrouping(KEY key, IState<VALUE>* state) : Key(key), IEnumerable<VALUE>(state) {}